

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O2

int deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::genMaxSSBlocksSource
              (NegativeTestContext *ctx,GLenum glShaderType,ProgramSources *sources)

{
  int iVar1;
  ShaderType SVar2;
  GLenum in_R8D;
  string shaderSrc;
  string sStack_48;
  
  iVar1 = getMaxSSBlockSize(ctx,glShaderType);
  (anonymous_namespace)::genBlockSource_abi_cxx11_
            (&sStack_48,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(long)iVar1,
             (ulong)glShaderType,in_R8D);
  SVar2 = getGLUShaderType(glShaderType);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources->sources + SVar2,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return iVar1;
}

Assistant:

int genMaxSSBlocksSource (NegativeTestContext& ctx, glw::GLenum glShaderType, glu::ProgramSources& sources)
{
	int		maxSSBlocks				= getMaxSSBlockSize(ctx, glShaderType);
	const	std::string shaderSrc	= genBlockSource(ctx, (maxSSBlocks), glShaderType);

	sources.sources[getGLUShaderType(glShaderType)].push_back(shaderSrc);

	return maxSSBlocks;
}